

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_mload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int min_level;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char buf [4608];
  char local_2418 [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_2418);
  txt = "Syntax: load mob <vnum>.\n\r";
  if (local_2418[0] != '\0') {
    bVar1 = is_number(local_2418);
    if (bVar1) {
      atoi(local_2418);
      pMobIndex = get_mob_index(0);
      if (pMobIndex == (MOB_INDEX_DATA *)0x0) {
        txt = "No mob has that vnum.\n\r";
      }
      else {
        ch_00 = create_mobile(pMobIndex);
        char_to_room(ch_00,ch->in_room);
        act("$n has created $N!",ch,(void *)0x0,ch_00,(uint)(0x32 < ch->invis_level) * 5);
        sprintf(local_1218,"$N loads %s.",ch_00->short_descr);
        min_level = get_trust(ch);
        wiznet(local_1218,ch,(OBJ_DATA *)0x0,0x10,0xc,min_level);
        txt = "Ok.\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_mload(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	MOB_INDEX_DATA *pMobIndex;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0' || !is_number(arg))
	{
		send_to_char("Syntax: load mob <vnum>.\n\r", ch);
		return;
	}

	pMobIndex = get_mob_index(atoi(arg));

	if (pMobIndex == nullptr)
	{
		send_to_char("No mob has that vnum.\n\r", ch);
		return;
	}

	victim = create_mobile(pMobIndex);

	char_to_room(victim, ch->in_room);

	act("$n has created $N!", ch, nullptr, victim, ch->invis_level > 50 ? TO_IMMINROOM : TO_ROOM);

	sprintf(buf, "$N loads %s.", victim->short_descr);
	wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}